

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdesktopunixservices.cpp
# Opt level: O2

QPlatformServiceColorPicker * __thiscall
QDesktopUnixServices::colorPicker(QDesktopUnixServices *this,QWindow *parent)

{
  char cVar1;
  QPlatformServiceColorPicker *this_00;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  cVar1 = qEnvironmentVariableIsEmpty("WAYLAND_DISPLAY");
  if (cVar1 != '\0') {
    QGuiApplication::platformName();
    cVar1 = QString::startsWith((QLatin1String *)&local_48,7);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    if (cVar1 == '\0') {
      this_00 = (QPlatformServiceColorPicker *)0x0;
      goto LAB_0057bec4;
    }
  }
  this_00 = (QPlatformServiceColorPicker *)operator_new(0x28);
  (*(this->super_QPlatformServices)._vptr_QPlatformServices[7])(&local_48,this,parent);
  QPlatformServiceColorPicker::QObject(this_00,&parent->super_QObject);
  *(undefined ***)this_00 = &PTR_metaObject_0078c480;
  *(Data **)(this_00 + 1) = local_48.d;
  *(char16_t **)&this_00[1].field_0x8 = local_48.ptr;
  *(qsizetype *)(this_00 + 2) = local_48.size;
  if (local_48.d != (Data *)0x0) {
    LOCK();
    ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
LAB_0057bec4:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return this_00;
  }
  __stack_chk_fail();
}

Assistant:

QPlatformServiceColorPicker *QDesktopUnixServices::colorPicker(QWindow *parent)
{
#if QT_CONFIG(dbus)
    // Make double sure that we are in a wayland environment. In particular check
    // WAYLAND_DISPLAY so also XWayland apps benefit from portal-based color picking.
    // Outside wayland we'll rather rely on other means than the XDG desktop portal.
    if (!qEnvironmentVariableIsEmpty("WAYLAND_DISPLAY")
        || QGuiApplication::platformName().startsWith("wayland"_L1)) {
        return new XdgDesktopPortalColorPicker(portalWindowIdentifier(parent), parent);
    }
    return nullptr;
#else
    Q_UNUSED(parent);
    return nullptr;
#endif
}